

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToDisplayBehind(ImGuiWindow *window,ImGuiWindow *behind_window)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  long lVar5;
  ImGuiWindow **ppIVar6;
  int iVar7;
  ImGuiContext *g;
  ImGuiWindow **data;
  ImGuiWindow **ppIVar8;
  
  pIVar3 = GImGui;
  pIVar1 = window->RootWindow;
  ppIVar2 = (GImGui->Windows).Data;
  lVar5 = (long)(GImGui->Windows).Size;
  ppIVar8 = ppIVar2;
  if (lVar5 < 1) {
    uVar4 = 0;
  }
  else {
    ppIVar6 = ppIVar2;
    do {
      if (*ppIVar6 == pIVar1) break;
      ppIVar6 = ppIVar6 + 1;
    } while (ppIVar6 < ppIVar2 + lVar5);
    uVar4 = (uint)((ulong)((long)ppIVar6 - (long)ppIVar2) >> 3);
    do {
      if (*ppIVar8 == behind_window->RootWindow) break;
      ppIVar8 = ppIVar8 + 1;
    } while (ppIVar8 < ppIVar2 + lVar5);
  }
  iVar7 = (int)((ulong)((long)ppIVar8 - (long)ppIVar2) >> 3);
  if ((int)uVar4 < iVar7) {
    memmove(ppIVar2 + (int)uVar4,ppIVar2 + (long)(int)uVar4 + 1,(long)(int)(~uVar4 + iVar7) << 3);
    lVar5 = ((long)ppIVar8 - (long)ppIVar2) * 0x20000000 + -0x100000000 >> 0x20;
  }
  else {
    lVar5 = (long)iVar7;
    memmove(ppIVar2 + lVar5 + 1,ppIVar2 + lVar5,(long)(int)(uVar4 - iVar7) << 3);
  }
  (pIVar3->Windows).Data[lVar5] = pIVar1;
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBehind(ImGuiWindow* window, ImGuiWindow* behind_window)
{
    IM_ASSERT(window != NULL && behind_window != NULL);
    ImGuiContext& g = *GImGui;
    window = window->RootWindow;
    behind_window = behind_window->RootWindow;
    int pos_wnd = FindWindowDisplayIndex(window);
    int pos_beh = FindWindowDisplayIndex(behind_window);
    if (pos_wnd < pos_beh)
    {
        size_t copy_bytes = (pos_beh - pos_wnd - 1) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_wnd], &g.Windows.Data[pos_wnd + 1], copy_bytes);
        g.Windows[pos_beh - 1] = window;
    }
    else
    {
        size_t copy_bytes = (pos_wnd - pos_beh) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_beh + 1], &g.Windows.Data[pos_beh], copy_bytes);
        g.Windows[pos_beh] = window;
    }
}